

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dr_wav.h
# Opt level: O0

drwav_int16 *
drwav_open_file_and_read_s16
          (char *filename,uint *channels,uint *sampleRate,drwav_uint64 *totalSampleCount)

{
  drwav_bool32 dVar1;
  undefined8 *in_RCX;
  undefined4 *in_RDX;
  undefined4 *in_RSI;
  drwav wav;
  char *in_stack_fffffffffffffe38;
  drwav *in_stack_fffffffffffffe40;
  drwav_uint64 *in_stack_fffffffffffffe50;
  uint *in_stack_fffffffffffffe58;
  uint *in_stack_fffffffffffffe60;
  drwav *in_stack_fffffffffffffe68;
  undefined8 local_8;
  
  if (in_RDX != (undefined4 *)0x0) {
    *in_RDX = 0;
  }
  if (in_RSI != (undefined4 *)0x0) {
    *in_RSI = 0;
  }
  if (in_RCX != (undefined8 *)0x0) {
    *in_RCX = 0;
  }
  dVar1 = drwav_init_file(in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
  if (dVar1 == 0) {
    local_8 = (drwav_int16 *)0x0;
  }
  else {
    local_8 = drwav__read_and_close_s16
                        (in_stack_fffffffffffffe68,in_stack_fffffffffffffe60,
                         in_stack_fffffffffffffe58,in_stack_fffffffffffffe50);
  }
  return local_8;
}

Assistant:

drwav_int16* drwav_open_file_and_read_s16(const char* filename, unsigned int* channels, unsigned int* sampleRate, drwav_uint64* totalSampleCount)
{
    if (sampleRate) *sampleRate = 0;
    if (channels) *channels = 0;
    if (totalSampleCount) *totalSampleCount = 0;

    drwav wav;
    if (!drwav_init_file(&wav, filename)) {
        return NULL;
    }

    return drwav__read_and_close_s16(&wav, channels, sampleRate, totalSampleCount);
}